

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O3

PaError ValidateOpenStreamParameters
                  (PaStreamParameters *inputParameters,PaStreamParameters *outputParameters,
                  double sampleRate,unsigned_long framesPerBuffer,PaStreamFlags streamFlags,
                  PaStreamCallback *streamCallback,PaUtilHostApiRepresentation **hostApi,
                  PaDeviceIndex *hostApiInputDevice,PaDeviceIndex *hostApiOutputDevice)

{
  PaUtilHostApiRepresentation *pPVar1;
  PaUtilHostApiRepresentation **ppPVar2;
  uint uVar3;
  PaError PVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  
  ppPVar2 = hostApis_;
  if (inputParameters == (PaStreamParameters *)0x0 && outputParameters == (PaStreamParameters *)0x0)
  {
    return -0x270c;
  }
  if (inputParameters == (PaStreamParameters *)0x0) {
    *hostApiInputDevice = -1;
    uVar3 = 0xffffffff;
LAB_0010b2f8:
    ppPVar2 = hostApis_;
    if (outputParameters == (PaStreamParameters *)0x0) {
      *hostApiOutputDevice = -1;
    }
    else {
      iVar6 = outputParameters->device;
      if (iVar6 == -2) {
        if (outputParameters->hostApiSpecificStreamInfo == (void *)0x0) {
          return -0x270c;
        }
        if (initializationCount_ == 0) {
          uVar5 = 0xffffd8f0;
        }
        else {
          uVar5 = 0xffffd905;
          if (0 < (long)hostApisCount_) {
            lVar7 = 0;
            do {
              if ((hostApis_[lVar7]->info).type ==
                  *(PaHostApiTypeId *)((long)outputParameters->hostApiSpecificStreamInfo + 8)) {
                uVar5 = (uint)lVar7;
                break;
              }
              lVar7 = lVar7 + 1;
            } while (hostApisCount_ != lVar7);
          }
        }
        *hostApiOutputDevice = -2;
        *hostApi = ppPVar2[(int)uVar5];
      }
      else {
        if (iVar6 < 0) goto LAB_0010b466;
        if (deviceCount_ <= iVar6) {
          return -0x270c;
        }
        uVar5 = FindHostApi(iVar6,hostApiOutputDevice);
        if ((int)uVar5 < 0) {
          return -0x2702;
        }
        pPVar1 = hostApis_[uVar5];
        *hostApi = pPVar1;
        if (outputParameters->channelCount < 1) {
          return -0x270e;
        }
        iVar6 = SampleFormatIsValid(outputParameters->sampleFormat);
        if (iVar6 == 0) {
          return -0x270a;
        }
        if ((outputParameters->hostApiSpecificStreamInfo != (void *)0x0) &&
           (*(PaHostApiTypeId *)((long)outputParameters->hostApiSpecificStreamInfo + 8) !=
            (pPVar1->info).type)) {
          return -0x2700;
        }
      }
      if ((inputParameters != (PaStreamParameters *)0x0) && (uVar3 != uVar5)) {
        return -0x2709;
      }
    }
    PVar4 = -0x270d;
    if ((((1000.0 <= sampleRate) && (sampleRate <= 384000.0)) &&
        (PVar4 = -0x270b, (streamFlags & 0xffffffff0000fff0) == 0)) &&
       (((streamFlags & 4) == 0 ||
        (((inputParameters != (PaStreamParameters *)0x0 &&
          (outputParameters != (PaStreamParameters *)0x0)) &&
         ((framesPerBuffer == 0 && (streamCallback != (PaStreamCallback *)0x0)))))))) {
      PVar4 = 0;
    }
  }
  else {
    iVar6 = inputParameters->device;
    if (iVar6 == -2) {
      if (inputParameters->hostApiSpecificStreamInfo != (void *)0x0) {
        if (initializationCount_ == 0) {
          uVar3 = 0xffffd8f0;
        }
        else {
          uVar3 = 0xffffd905;
          if (0 < (long)hostApisCount_) {
            lVar7 = 0;
            do {
              if ((hostApis_[lVar7]->info).type ==
                  *(PaHostApiTypeId *)((long)inputParameters->hostApiSpecificStreamInfo + 8)) {
                uVar3 = (uint)lVar7;
                break;
              }
              lVar7 = lVar7 + 1;
            } while (hostApisCount_ != lVar7);
          }
        }
        *hostApiInputDevice = -2;
        *hostApi = ppPVar2[(int)uVar3];
        goto LAB_0010b2f8;
      }
    }
    else if ((-1 < iVar6) && (iVar6 < deviceCount_)) {
      uVar3 = FindHostApi(iVar6,hostApiInputDevice);
      if ((int)uVar3 < 0) {
        return -0x2702;
      }
      pPVar1 = hostApis_[uVar3];
      *hostApi = pPVar1;
      if (inputParameters->channelCount < 1) {
        return -0x270e;
      }
      iVar6 = SampleFormatIsValid(inputParameters->sampleFormat);
      if (iVar6 == 0) {
        return -0x270a;
      }
      if ((inputParameters->hostApiSpecificStreamInfo != (void *)0x0) &&
         (*(PaHostApiTypeId *)((long)inputParameters->hostApiSpecificStreamInfo + 8) !=
          (pPVar1->info).type)) {
        return -0x2700;
      }
      goto LAB_0010b2f8;
    }
LAB_0010b466:
    PVar4 = -0x270c;
  }
  return PVar4;
}

Assistant:

static PaError ValidateOpenStreamParameters(
    const PaStreamParameters *inputParameters,
    const PaStreamParameters *outputParameters,
    double sampleRate,
    unsigned long framesPerBuffer,
    PaStreamFlags streamFlags,
    PaStreamCallback *streamCallback,
    PaUtilHostApiRepresentation **hostApi,
    PaDeviceIndex *hostApiInputDevice,
    PaDeviceIndex *hostApiOutputDevice )
{
    int inputHostApiIndex  = -1;    /* Suppress uninitialised var warnings: compiler does */
    int outputHostApiIndex = -1;    /* not see that if inputParameters and outputParameters  */
                                    /* are both nonzero, these indices are set. */

    if( (inputParameters == NULL) && (outputParameters == NULL) )
    {
        return paInvalidDevice; /** @todo should be a new error code "invalid device parameters" or something */
    }
    else
    {
        if( inputParameters == NULL )
        {
            *hostApiInputDevice = paNoDevice;
        }
        else if( inputParameters->device == paUseHostApiSpecificDeviceSpecification )
        {
            if( inputParameters->hostApiSpecificStreamInfo )
            {
                inputHostApiIndex = Pa_HostApiTypeIdToHostApiIndex(
                        ((PaUtilHostApiSpecificStreamInfoHeader*)inputParameters->hostApiSpecificStreamInfo)->hostApiType );

                if( inputHostApiIndex != -1 )
                {
                    *hostApiInputDevice = paUseHostApiSpecificDeviceSpecification;
                    *hostApi = hostApis_[inputHostApiIndex];
                }
                else
                {
                    return paInvalidDevice;
                }
            }
            else
            {
                return paInvalidDevice;
            }
        }
        else
        {
            if( inputParameters->device < 0 || inputParameters->device >= deviceCount_ )
                return paInvalidDevice;

            inputHostApiIndex = FindHostApi( inputParameters->device, hostApiInputDevice );
            if( inputHostApiIndex < 0 )
                return paInternalError;

            *hostApi = hostApis_[inputHostApiIndex];

            if( inputParameters->channelCount <= 0 )
                return paInvalidChannelCount;

            if( !SampleFormatIsValid( inputParameters->sampleFormat ) )
                return paSampleFormatNotSupported;

            if( inputParameters->hostApiSpecificStreamInfo != NULL )
            {
                if( ((PaUtilHostApiSpecificStreamInfoHeader*)inputParameters->hostApiSpecificStreamInfo)->hostApiType
                        != (*hostApi)->info.type )
                    return paIncompatibleHostApiSpecificStreamInfo;
            }
        }

        if( outputParameters == NULL )
        {
            *hostApiOutputDevice = paNoDevice;
        }
        else if( outputParameters->device == paUseHostApiSpecificDeviceSpecification  )
        {
            if( outputParameters->hostApiSpecificStreamInfo )
            {
                outputHostApiIndex = Pa_HostApiTypeIdToHostApiIndex(
                        ((PaUtilHostApiSpecificStreamInfoHeader*)outputParameters->hostApiSpecificStreamInfo)->hostApiType );

                if( outputHostApiIndex != -1 )
                {
                    *hostApiOutputDevice = paUseHostApiSpecificDeviceSpecification;
                    *hostApi = hostApis_[outputHostApiIndex];
                }
                else
                {
                    return paInvalidDevice;
                }
            }
            else
            {
                return paInvalidDevice;
            }
        }
        else
        {
            if( outputParameters->device < 0 || outputParameters->device >= deviceCount_ )
                return paInvalidDevice;

            outputHostApiIndex = FindHostApi( outputParameters->device, hostApiOutputDevice );
            if( outputHostApiIndex < 0 )
                return paInternalError;

            *hostApi = hostApis_[outputHostApiIndex];

            if( outputParameters->channelCount <= 0 )
                return paInvalidChannelCount;

            if( !SampleFormatIsValid( outputParameters->sampleFormat ) )
                return paSampleFormatNotSupported;

            if( outputParameters->hostApiSpecificStreamInfo != NULL )
            {
                if( ((PaUtilHostApiSpecificStreamInfoHeader*)outputParameters->hostApiSpecificStreamInfo)->hostApiType
                        != (*hostApi)->info.type )
                    return paIncompatibleHostApiSpecificStreamInfo;
            }
        }

        if( (inputParameters != NULL) && (outputParameters != NULL) )
        {
            /* ensure that both devices use the same API */
            if( inputHostApiIndex != outputHostApiIndex )
                return paBadIODeviceCombination;
        }
    }


    /* Check for absurd sample rates. */
    if( (sampleRate < 1000.0) || (sampleRate > 384000.0) )
        return paInvalidSampleRate;

    if( ((streamFlags & ~paPlatformSpecificFlags) & ~(paClipOff | paDitherOff | paNeverDropInput | paPrimeOutputBuffersUsingStreamCallback ) ) != 0 )
        return paInvalidFlag;

    if( streamFlags & paNeverDropInput )
    {
        /* must be a callback stream */
        if( !streamCallback )
            return paInvalidFlag;

        /* must be a full duplex stream */
        if( (inputParameters == NULL) || (outputParameters == NULL) )
            return paInvalidFlag;

        /* must use paFramesPerBufferUnspecified */
        if( framesPerBuffer != paFramesPerBufferUnspecified )
            return paInvalidFlag;
    }

    return paNoError;
}